

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **args)

{
  Box<objectbox::tsdemo::SensorValues> box;
  ostream *poVar1;
  char *pcVar2;
  ulong uVar3;
  OBX_model *model;
  int64_t now;
  StopWatch local_120 [4];
  StopWatch local_100;
  StopWatch stopWatch;
  vector<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_> values;
  int dataCount;
  int64_t start;
  Box<objectbox::tsdemo::SensorValues> boxSV;
  Box<objectbox::tsdemo::NamedTimeRange> boxNTR;
  Store store;
  Options local_20;
  Options options;
  char **args_local;
  int argc_local;
  
  options.opt = (OBX_store_options *)args;
  poVar1 = std::operator<<((ostream *)&std::cout,"ObjectBox TS demo using ObjectBox library ");
  pcVar2 = (char *)obx_version_string();
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1," (core: ");
  pcVar2 = (char *)obx_version_core_string();
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  uVar3 = obx_has_feature(2);
  if ((uVar3 & 1) == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "This time series demo requires ObjectBox TS, a special time series edition."
                            );
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "To get ObjectBox TS, please visit https://objectbox.io/time-series-database/."
                            );
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  model = create_obx_model();
  obx::Options::Options(&local_20,model);
  obx::Options::maxDbSizeInKb(&local_20,0xa00000);
  obx::Store::Store((Store *)&boxNTR.super_BoxTypeless.entityTypeId_,&local_20);
  obx::Box<objectbox::tsdemo::NamedTimeRange>::Box
            ((Box<objectbox::tsdemo::NamedTimeRange> *)&boxSV.super_BoxTypeless.entityTypeId_,
             (Store *)&boxNTR.super_BoxTypeless.entityTypeId_);
  obx::Box<objectbox::tsdemo::SensorValues>::Box
            ((Box<objectbox::tsdemo::SensorValues> *)&start,
             (Store *)&boxNTR.super_BoxTypeless.entityTypeId_);
  poVar1 = std::operator<<((ostream *)&std::cout,"ObjectBox store opened");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  now = millisSinceEpoch();
  obx::BoxTypeless::removeAll((BoxTypeless *)&boxSV.super_BoxTypeless.entityTypeId_);
  box.super_BoxTypeless.cBox_ = (OBX_box *)boxSV.super_BoxTypeless.store_;
  box.super_BoxTypeless.store_ = (Store *)start;
  box.super_BoxTypeless._16_8_ = boxSV.super_BoxTypeless.cBox_;
  removeDataBefore(box,now + -5000);
  createSensorValueData
            ((vector<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
              *)&stopWatch,now,1000000);
  objectbox::StopWatch::StopWatch(&local_100);
  obx::Box<objectbox::tsdemo::SensorValues>::put
            ((Box<objectbox::tsdemo::SensorValues> *)&start,
             (vector<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
              *)&stopWatch,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0,
             OBXPutMode_PUT);
  poVar1 = std::operator<<((ostream *)&std::cout,"Put ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,1000000);
  poVar1 = std::operator<<(poVar1," objects in ");
  objectbox::StopWatch::durationForLog_abi_cxx11_(local_120);
  poVar1 = std::operator<<(poVar1,(string *)local_120);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_120);
  std::vector<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>::
  clear((vector<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_> *
        )&stopWatch);
  putAndPrintNamedTimeRanges
            ((Box<objectbox::tsdemo::NamedTimeRange> *)&boxSV.super_BoxTypeless.entityTypeId_,now);
  printMinMaxTime((Box<objectbox::tsdemo::SensorValues> *)&start,now);
  buildAndRunQueries((Box<objectbox::tsdemo::SensorValues> *)&start,now);
  std::vector<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>::
  ~vector((vector<objectbox::tsdemo::SensorValues,_std::allocator<objectbox::tsdemo::SensorValues>_>
           *)&stopWatch);
  obx::Store::~Store((Store *)&boxNTR.super_BoxTypeless.entityTypeId_);
  obx::Options::~Options(&local_20);
  return 0;
}

Assistant:

int main(int argc, char* args[]) {
    std::cout << "ObjectBox TS demo using ObjectBox library " << obx_version_string()
              << " (core: " << obx_version_core_string() << ")" << std::endl;

    if (!obx_has_feature(OBXFeature_TimeSeries)) {
        std::cout << "This time series demo requires ObjectBox TS, a special time series edition." << std::endl;
        std::cout << "To get ObjectBox TS, please visit https://objectbox.io/time-series-database/." << std::endl;
        exit(1);
    }

    // Init ObjectBox store and boxes
    obx::Options options(create_obx_model());
    options.maxDbSizeInKb(10 * 1024 * 1024);  // 10 GB to allow data from several runs
    obx::Store store(options);
    obx::Box<NamedTimeRange> boxNTR(store);
    obx::Box<SensorValues> boxSV(store);
    std::cout << "ObjectBox store opened" << std::endl;

    int64_t start = millisSinceEpoch();
    boxNTR.removeAll();
    removeDataBefore(boxSV, start - 5000);  // Older than 5s
    // boxSV.removeAll();  // Or remove all if you prefer consistent data each run

    // Create some SensorValues dummy data and put it in the database (while measuring the time for put)
    int dataCount = 1000000;
    std::vector<SensorValues> values = createSensorValueData(start, dataCount);
    StopWatch stopWatch;
    boxSV.put(values);
    std::cout << "Put " << dataCount << " objects in " << stopWatch.durationForLog() << std::endl;
    values.clear();  // Free memory for putted objects (optional)

    putAndPrintNamedTimeRanges(boxNTR, start);

    printMinMaxTime(boxSV, start);

    buildAndRunQueries(boxSV, start);

    return 0;
}